

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ec_sign.c
# Opt level: O1

int fill_GOST_EC_params(EC_KEY *eckey,int nid)

{
  R3410_ec_params *pRVar1;
  int iVar2;
  BN_CTX *ctx;
  EC_GROUP *group;
  EC_POINT *generator;
  int iVar3;
  R3410_ec_params *pRVar4;
  undefined1 auVar5 [16];
  BIGNUM *y;
  BIGNUM *x;
  BIGNUM *b;
  BIGNUM *a;
  BIGNUM *q;
  BIGNUM *p;
  BIGNUM *cofactor;
  BIGNUM *local_68;
  BIGNUM *local_60;
  BIGNUM *local_58;
  BIGNUM *local_50;
  BIGNUM *local_48;
  BIGNUM *local_40;
  BIGNUM *local_38;
  
  iVar2 = nid + -0x158;
  if (2 < nid - 0x4a0U) {
    iVar2 = nid;
  }
  pRVar4 = R3410_2012_512_paramset;
  iVar3 = R3410_2012_512_paramset[0].nid;
  while (iVar3 != 0) {
    if (iVar3 == iVar2) goto LAB_0011f789;
    pRVar1 = pRVar4 + 1;
    pRVar4 = pRVar4 + 1;
    iVar3 = pRVar1->nid;
  }
  pRVar4 = R3410_2001_paramset;
  iVar3 = R3410_2001_paramset[0].nid;
  while (iVar3 != 0) {
    if (iVar3 == iVar2) goto LAB_0011f789;
    pRVar1 = pRVar4 + 1;
    pRVar4 = pRVar4 + 1;
    iVar3 = pRVar1->nid;
  }
  pRVar4 = (R3410_ec_params *)0x0;
LAB_0011f789:
  local_40 = (BIGNUM *)0x0;
  local_48 = (BIGNUM *)0x0;
  local_50 = (BIGNUM *)0x0;
  local_58 = (BIGNUM *)0x0;
  local_60 = (BIGNUM *)0x0;
  local_68 = (BIGNUM *)0x0;
  local_38 = (BIGNUM *)0x0;
  if (eckey == (EC_KEY *)0x0 || pRVar4 == (R3410_ec_params *)0x0) {
    iVar3 = 0x83;
    iVar2 = 0x65;
LAB_0011f824:
    ERR_GOST_error(0x66,iVar3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_sign.c"
                   ,iVar2);
    return 0;
  }
  if ((EC_GROUP *)pRVar4->group == (EC_GROUP *)0x0) {
    iVar2 = nid;
    ctx = BN_CTX_new();
    if (ctx == (BN_CTX *)0x0) {
      iVar3 = 0xc0100;
      iVar2 = 0x73;
      goto LAB_0011f824;
    }
    BN_CTX_start(ctx);
    local_40 = BN_CTX_get(ctx);
    local_50 = BN_CTX_get(ctx);
    local_58 = BN_CTX_get(ctx);
    local_60 = BN_CTX_get(ctx);
    local_68 = BN_CTX_get(ctx);
    local_48 = BN_CTX_get(ctx);
    local_38 = BN_CTX_get(ctx);
    auVar5._0_4_ = -(uint)((int)((ulong)local_40 >> 0x20) == 0 && (int)local_40 == 0);
    auVar5._4_4_ = -(uint)((int)local_50 == 0 && (int)((ulong)local_50 >> 0x20) == 0);
    auVar5._8_4_ = -(uint)((int)((ulong)local_58 >> 0x20) == 0 && (int)local_58 == 0);
    auVar5._12_4_ = -(uint)((int)local_60 == 0 && (int)((ulong)local_60 >> 0x20) == 0);
    iVar2 = movmskps(iVar2,auVar5);
    if (((local_48 == (BIGNUM *)0x0 || local_68 == (BIGNUM *)0x0) || iVar2 != 0) ||
        local_38 == (BIGNUM *)0x0) {
      iVar3 = 0xc0100;
      iVar2 = 0x80;
    }
    else {
      iVar2 = BN_hex2bn(&local_40,pRVar4->p);
      if ((((iVar2 == 0) || (iVar2 = BN_hex2bn(&local_50,pRVar4->a), iVar2 == 0)) ||
          (iVar2 = BN_hex2bn(&local_58,pRVar4->b), iVar2 == 0)) ||
         (iVar2 = BN_hex2bn(&local_38,pRVar4->cofactor), iVar2 == 0)) {
        iVar3 = 0xc0103;
        iVar2 = 0x88;
      }
      else {
        group = EC_GROUP_new_curve_GFp(local_40,local_50,local_58,ctx);
        if (group == (EC_GROUP *)0x0) {
          iVar3 = 0xc0100;
          iVar2 = 0x8e;
        }
        else {
          generator = EC_POINT_new(group);
          if (generator != (EC_POINT *)0x0) {
            iVar2 = BN_hex2bn(&local_60,pRVar4->x);
            if (((iVar2 == 0) || (iVar2 = BN_hex2bn(&local_68,pRVar4->y), iVar2 == 0)) ||
               ((iVar2 = EC_POINT_set_affine_coordinates(group,generator,local_60,local_68,ctx),
                iVar2 == 0 || (iVar2 = BN_hex2bn(&local_48,pRVar4->q), iVar2 == 0)))) {
              iVar2 = 0x9c;
            }
            else {
              iVar2 = EC_GROUP_set_generator(group,generator,local_48,local_38);
              if (iVar2 == 0) {
                iVar2 = 0xa1;
              }
              else {
                EC_GROUP_set_curve_name(group,nid);
                pRVar4->group = (EC_GROUP *)group;
                iVar2 = EC_KEY_set_group((EC_KEY *)eckey,group);
                iVar3 = 1;
                if (iVar2 != 0) goto LAB_0011faa7;
                iVar2 = 0xa7;
              }
            }
            ERR_GOST_error(0x66,0xc0103,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_sign.c"
                           ,iVar2);
            goto LAB_0011faa4;
          }
          iVar3 = 0xc0100;
          iVar2 = 0x94;
        }
      }
    }
    ERR_GOST_error(0x66,iVar3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_sign.c"
                   ,iVar2);
    generator = (EC_POINT *)0x0;
  }
  else {
    EC_GROUP_set_curve_name((EC_GROUP *)pRVar4->group,nid);
    iVar2 = EC_KEY_set_group((EC_KEY *)eckey,(EC_GROUP *)pRVar4->group);
    if (iVar2 != 0) {
      return 1;
    }
    ERR_GOST_error(0x66,0xc0103,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_sign.c"
                   ,0x6c);
    generator = (EC_POINT *)0x0;
    ctx = (BN_CTX *)0x0;
  }
LAB_0011faa4:
  iVar3 = 0;
LAB_0011faa7:
  EC_POINT_free(generator);
  BN_CTX_end(ctx);
  BN_CTX_free(ctx);
  return iVar3;
}

Assistant:

int fill_GOST_EC_params(EC_KEY *eckey, int nid)
{
    R3410_ec_params *params = gost_nid2params(nid);
    EC_GROUP *grp = NULL;
    EC_POINT *P = NULL;
    BIGNUM *p = NULL, *q = NULL, *a = NULL, *b = NULL, *x = NULL, *y =
        NULL, *cofactor = NULL;
    BN_CTX *ctx = NULL;
    int ok = 0;

    if (!eckey || !params) {
        GOSTerr(GOST_F_FILL_GOST_EC_PARAMS, GOST_R_UNSUPPORTED_PARAMETER_SET);
        return 0;
    }

    if (params->group) {
        EC_GROUP_set_curve_name(params->group, nid);
        if (!EC_KEY_set_group(eckey, params->group)) {
            GOSTerr(GOST_F_FILL_GOST_EC_PARAMS, ERR_R_INTERNAL_ERROR);
            goto end;
        }
        return 1;
    }

    if (!(ctx = BN_CTX_new())) {
        GOSTerr(GOST_F_FILL_GOST_EC_PARAMS, ERR_R_MALLOC_FAILURE);
        return 0;
    }

    BN_CTX_start(ctx);
    p = BN_CTX_get(ctx);
    a = BN_CTX_get(ctx);
    b = BN_CTX_get(ctx);
    x = BN_CTX_get(ctx);
    y = BN_CTX_get(ctx);
    q = BN_CTX_get(ctx);
    cofactor = BN_CTX_get(ctx);
    if (!p || !a || !b || !x || !y || !q || !cofactor) {
        GOSTerr(GOST_F_FILL_GOST_EC_PARAMS, ERR_R_MALLOC_FAILURE);
        goto end;
    }

    if (!BN_hex2bn(&p, params->p)
        || !BN_hex2bn(&a, params->a)
        || !BN_hex2bn(&b, params->b)
        || !BN_hex2bn(&cofactor, params->cofactor)) {
        GOSTerr(GOST_F_FILL_GOST_EC_PARAMS, ERR_R_INTERNAL_ERROR);
        goto end;
    }

    grp = EC_GROUP_new_curve_GFp(p, a, b, ctx);
    if (!grp) {
        GOSTerr(GOST_F_FILL_GOST_EC_PARAMS, ERR_R_MALLOC_FAILURE);
        goto end;
    }

    P = EC_POINT_new(grp);
    if (!P) {
        GOSTerr(GOST_F_FILL_GOST_EC_PARAMS, ERR_R_MALLOC_FAILURE);
        goto end;
    }

    if (!BN_hex2bn(&x, params->x)
        || !BN_hex2bn(&y, params->y)
        || !EC_POINT_set_affine_coordinates(grp, P, x, y, ctx)
        || !BN_hex2bn(&q, params->q)) {
        GOSTerr(GOST_F_FILL_GOST_EC_PARAMS, ERR_R_INTERNAL_ERROR);
        goto end;
    }

    if (!EC_GROUP_set_generator(grp, P, q, cofactor)) {
        GOSTerr(GOST_F_FILL_GOST_EC_PARAMS, ERR_R_INTERNAL_ERROR);
        goto end;
    }
    EC_GROUP_set_curve_name(grp, nid);
    params->group = grp;
    if (!EC_KEY_set_group(eckey, grp)) {
        GOSTerr(GOST_F_FILL_GOST_EC_PARAMS, ERR_R_INTERNAL_ERROR);
        goto end;
    }
    ok = 1;
 end:
    EC_POINT_free(P);
    BN_CTX_end(ctx);
    BN_CTX_free(ctx);
    return ok;
}